

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

bool __thiscall
kws::Parser::IsBetweenSingleQuote(Parser *this,size_t pos,bool withComments,string *buffer)

{
  pointer pcVar1;
  bool bVar2;
  string stream;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  pcVar1 = (buffer->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + buffer->_M_string_length);
  if (1 < pos + 1) {
    if (buffer->_M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_48);
      if (withComments) {
        std::__cxx11::string::_M_assign((string *)&local_48);
      }
    }
    if (((pos != 1) || (*local_48 == '\'')) && (local_40 - 1U != pos)) {
      if ((local_48[pos - 1] == '\'') ||
         ((local_48[pos - 1] == '\\' && (local_48[pos - 2] == '\'')))) {
        bVar2 = local_48[pos + 1] == '\'';
        goto LAB_001236d9;
      }
    }
  }
  bVar2 = false;
LAB_001236d9:
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return bVar2;
}

Assistant:

bool Parser::IsBetweenSingleQuote(size_t pos,bool withComments,std::string buffer) const
{
  std::string stream = buffer;

  if(pos == std::string::npos)
    {
    return false;
    }

  if(pos == 0)
    {
    return false;
    }

    if (buffer.empty()) {
      stream = m_BufferNoComment;
      if (withComments) {
        stream = m_Buffer;
      }
    }

  if(pos == 1 && stream[0] != '\'')
    {
    return false;
    }

  if(pos == stream.length()-1)
    {
    return false;
    }

  return ( ( stream[pos-1] == '\'' || ( stream[pos-1] == '\\' &&
       stream[pos-2] == '\'' ) ) && stream[pos+1] == '\'' );
}